

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall fasttext::Dictionary::find(Dictionary *this,string *w)

{
  char *pcVar1;
  int32_t iVar2;
  uint h;
  size_type sVar3;
  
  if (w->_M_string_length != 0) {
    h = 0x811c9dc5;
    sVar3 = 0;
    do {
      pcVar1 = (w->_M_dataplus)._M_p + sVar3;
      sVar3 = sVar3 + 1;
      h = ((int)*pcVar1 ^ h) * 0x1000193;
    } while (w->_M_string_length != sVar3);
    iVar2 = find(this,w,h);
    return iVar2;
  }
  iVar2 = find(this,w,0x811c9dc5);
  return iVar2;
}

Assistant:

int32_t Dictionary::find(const std::string& w) const {
	return find(w, hash(w));
}